

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O0

time_t mkgmtime(tm *ptm)

{
  bool bVar1;
  int year_00;
  int iVar2;
  int local_2c;
  int local_28;
  int m;
  int y;
  int year;
  time_t secs;
  tm *ptStack_10;
  anon_class_1_0_00000001 isLeapYear;
  tm *ptm_local;
  
  secs._7_1_ = 0;
  _y = 0;
  year_00 = ptm->tm_year + 0x76c;
  ptStack_10 = ptm;
  for (local_28 = 0x7b2; local_28 < year_00; local_28 = local_28 + 1) {
    bVar1 = mkgmtime::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&secs + 7),local_28);
    iVar2 = 0x16d;
    if (bVar1) {
      iVar2 = 0x16e;
    }
    _y = iVar2 * 0x15180 + _y;
  }
  for (local_2c = 0; local_2c < ptStack_10->tm_mon; local_2c = local_2c + 1) {
    _y = mkgmtime::DaysOfMonth[local_2c] * 0x15180 + _y;
    if ((local_2c == 1) &&
       (bVar1 = mkgmtime::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&secs + 7),year_00), bVar1)) {
      _y = _y + 0x15180;
    }
  }
  if (ptStack_10->tm_mday != 0) {
    _y = (ptStack_10->tm_mday + -1) * 0x15180 + _y;
  }
  return (long)ptStack_10->tm_sec +
         (long)(ptStack_10->tm_min * 0x3c) + ptStack_10->tm_hour * 0xe10 + _y;
}

Assistant:

inline std::time_t mkgmtime(const struct std::tm* ptm)
{
    static constexpr auto SecondsPerMinute = 60;
    static constexpr auto SecondsPerHour = 3600;
    static constexpr auto SecondsPerDay = 86400;

    static constexpr int DaysOfMonth[12] = {
        31, 28, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31
    };

    auto isLeapYear = [](int year)
    {
        if (year % 4 != 0)
            return false;
        if (year % 100 != 0)
            return true;

        return (year % 400) == 0;
    };

    std::time_t secs = 0;
    int year = ptm->tm_year + 1900;
    for (int y = 1970; y < year; ++y)
        secs += (isLeapYear(y) ? 366 : 365) * SecondsPerDay;
    for (int m = 0; m < ptm->tm_mon; ++m)
    {
        secs += DaysOfMonth[m] * SecondsPerDay;
        if (m == 1 && isLeapYear(year))
            secs += SecondsPerDay;
    }

    // ptm may reprensent a time only
    if (ptm->tm_mday)
        secs += (ptm->tm_mday - 1) * SecondsPerDay;
    secs += ptm->tm_hour       * SecondsPerHour;
    secs += ptm->tm_min        * SecondsPerMinute;
    secs += ptm->tm_sec;
    return secs;
}